

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O1

int64_t docio_read_doc(docio_handle *handle,uint64_t offset,docio_object *doc,
                      bool read_on_cache_miss)

{
  uint32_t *puVar1;
  err_log_callback *log_callback;
  bool bVar2;
  docio_length dVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  void *pvVar8;
  ushort uVar9;
  uint32_t *puVar10;
  fdb_status status;
  ulong uVar11;
  ulong __size;
  uint8_t *buf;
  size_t sVar12;
  filemgr *pfVar13;
  char *pcVar14;
  char *pcVar15;
  bool key_alloc;
  undefined1 auVar16 [16];
  bool local_a8;
  bool local_a4;
  docio_length _length;
  timestamp_t _timestamp;
  filemgr *local_78;
  uint32_t crc_file;
  fdb_seqnum_t _seqnum;
  uint32_t uStack_60;
  uint8_t uStack_5c;
  uint8_t uStack_5b;
  uint16_t uStack_5a;
  uint32_t *local_50;
  docio_length zero_length;
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  zero_length.keylen = 0;
  zero_length.metalen = 0;
  zero_length.bodylen = 0;
  zero_length.bodylen_ondisk = 0;
  zero_length.flag = '\0';
  zero_length.checksum = '\0';
  zero_length.reserved = 0;
  log_callback = handle->log_callback;
  uVar7 = _docio_read_length(handle,offset,&_length,log_callback,read_on_cache_miss);
  dVar3 = _length;
  if ((long)uVar7 < 0) {
    if (!read_on_cache_miss) {
      return uVar7;
    }
    pfVar13 = handle->file;
    pcVar15 = "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
    ;
    sVar12 = 0x4dc;
LAB_0011435c:
    fdb_log_impl(log_callback,2,(fdb_status)uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",sVar12,pcVar15,offset,pfVar13->filename);
    return uVar7;
  }
  zero_length.keylen = 0;
  zero_length.metalen = 0;
  zero_length.bodylen = 0;
  zero_length.bodylen_ondisk = 0;
  zero_length.flag = '\0';
  zero_length.checksum = '\0';
  zero_length.reserved = 0;
  auVar16[0] = -((char)_length.keylen == '\0');
  auVar16[1] = -(_length.keylen._1_1_ == '\0');
  auVar16[2] = -((char)_length.metalen == '\0');
  auVar16[3] = -(_length.metalen._1_1_ == '\0');
  auVar16[4] = -((char)_length.bodylen == '\0');
  auVar16[5] = -(_length.bodylen._1_1_ == '\0');
  auVar16[6] = -(_length.bodylen._2_1_ == '\0');
  auVar16[7] = -(_length.bodylen._3_1_ == '\0');
  auVar16[8] = -((char)_length.bodylen_ondisk == '\0');
  auVar16[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
  auVar16[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
  auVar16[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
  auVar16[0xc] = -(_length.flag == '\0');
  auVar16[0xd] = -(_length.checksum == '\0');
  auVar16[0xe] = -((char)_length.reserved == '\0');
  auVar16[0xf] = -(_length.reserved._1_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf)
      == 0xffff) {
    (doc->length).keylen = 0;
    (doc->length).metalen = 0;
    (doc->length).bodylen = 0;
    (doc->length).bodylen_ondisk = 0;
    (doc->length).flag = '\0';
    (doc->length).checksum = '\0';
    (doc->length).reserved = 0;
    return 0;
  }
  _seqnum._0_2_ = _length.keylen;
  _seqnum._2_2_ = _length.metalen;
  _seqnum._4_4_ = _length.bodylen;
  uStack_60 = _length.bodylen_ondisk;
  uStack_5c = _length.flag;
  uStack_5b = _length.checksum;
  uStack_5a = _length.reserved;
  _length = dVar3;
  uVar4 = get_checksum((uint8_t *)&_seqnum,0xc,handle->file->crc_mode);
  uVar6 = _length.bodylen_ondisk;
  if (_length.checksum != (uint8_t)uVar4) {
    fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",0x4f1,
                 "doc_length body checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                 ,handle->file->filename,(ulong)(uVar4 & 0xff),(ulong)_length.checksum,
                 (ulong)_length.keylen,(ulong)_length.metalen,(ulong)_length.bodylen,
                 (ulong)_length.bodylen_ondisk,offset);
    return -0xf;
  }
  uVar9 = _length.keylen << 8 | _length.keylen >> 8;
  uVar11 = _length._8_8_ & 0xffffffff00000000 |
           (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
  pcVar15 = (char *)(ulong)uVar9;
  *(char **)&doc->length =
       pcVar15 + CONCAT44(_length.bodylen << 0x18 | (uint)_length.bodylen._3_1_ |
                          _length.bodylen >> 8 & 0xff00 | (_length.bodylen & 0xff00) << 8,
                          (_length._1_4_ & 0xff00 | _length._3_4_ & 0xff) << 0x10);
  local_50 = &(doc->length).bodylen_ondisk;
  (doc->length).bodylen_ondisk = (int)uVar11;
  (doc->length).flag = (char)(uVar11 >> 0x20);
  (doc->length).checksum = (char)(uVar11 >> 0x28);
  (doc->length).reserved = (short)(uVar11 >> 0x30);
  if (((doc->length).flag & 0x10) != 0) {
    if ((((uVar9 == 0) && ((doc->length).metalen == 0)) && ((doc->length).bodylen == 0)) &&
       (*local_50 == 0)) {
      uVar7 = _docio_read_doc_component(handle,uVar7,8,&_seqnum,log_callback);
      if ((long)uVar7 < 0) {
        pfVar13 = handle->file;
        pcVar15 = 
        "Error in reading an offset of a committed doc from an offset %lu in a database file \'%s\'"
        ;
        sVar12 = 0x50d;
        goto LAB_0011435c;
      }
      uVar11 = _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
               (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
               (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 |
               (_seqnum & 0xff00) << 0x28 | _seqnum << 0x38;
      (doc->field_3).seqnum = uVar11;
      if (uVar11 <= (handle->file->pos).super___atomic_base<unsigned_long>._M_i) {
        return uVar7;
      }
      sVar12 = 0x519;
      offset = (handle->file->pos).super___atomic_base<unsigned_long>._M_i;
      pcVar15 = (char *)(doc->field_3).seqnum;
      pcVar14 = 
      "File corruption: Offset %lu of the actual doc pointed by the commit marker is greater than the size %lu of a database file \'%s\'"
      ;
    }
    else {
      pcVar14 = 
      "File corruption: Doc length fields in a transaction commit marker was not zero in a database file \'%s\' offset %lu"
      ;
      sVar12 = 0x501;
      pcVar15 = handle->file->filename;
    }
LAB_0011444d:
    fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",sVar12,pcVar14,pcVar15,offset);
    return -0x10;
  }
  __size = (ulong)(pcVar15 +
                  CONCAT44(_length.bodylen << 0x18 | (uint)_length.bodylen._3_1_ |
                           _length.bodylen >> 8 & 0xff00 | (_length.bodylen & 0xff00) << 8,
                           (_length._1_4_ & 0xff00 | _length._3_4_ & 0xff) << 0x10)) & 0xffff;
  uVar5 = (int)__size + 0xf;
  uVar11 = (ulong)uVar5;
  if ((ushort)uVar5 < 0x10) {
    pcVar14 = 
    "Error in decoding the doc length metadata (key length: %d) from a database file \'%s\' offset %lu"
    ;
    sVar12 = 0x524;
    offset = (uint64_t)handle->file->filename;
    goto LAB_0011444d;
  }
  key_alloc = doc->key == (void *)0x0;
  if (key_alloc) {
    pvVar8 = malloc(__size);
    doc->key = pvVar8;
    uVar11 = CONCAT71((int7)((ulong)pvVar8 >> 8),1);
  }
  local_78 = (filemgr *)CONCAT44(local_78._4_4_,(int)CONCAT71((int7)(uVar11 >> 8),1));
  if ((doc->meta == (void *)0x0) && (uVar11 = (ulong)(doc->length).metalen, uVar11 != 0)) {
    pvVar8 = malloc(uVar11);
    doc->meta = pvVar8;
    local_a4 = true;
    bVar2 = false;
  }
  else {
    local_a4 = false;
    bVar2 = true;
  }
  if ((doc->body == (void *)0x0) && (uVar11 = (ulong)(doc->length).bodylen, uVar11 != 0)) {
    pvVar8 = malloc(uVar11);
    doc->body = pvVar8;
    local_a8 = true;
    local_78 = (filemgr *)((ulong)local_78 & 0xffffffff00000000);
  }
  else {
    local_a8 = false;
  }
  uVar7 = _docio_read_doc_component(handle,uVar7,(uint)uVar9,doc->key,log_callback);
  if ((long)uVar7 < 0) {
    uVar11 = (ulong)(doc->length).keylen;
    pfVar13 = handle->file;
    pcVar15 = "Error in reading a key with offset %lu, length %d from a database file \'%s\'";
    sVar12 = 0x53d;
LAB_001146a6:
    status = (fdb_status)uVar7;
    pcVar14 = pfVar13->filename;
  }
  else {
    uVar7 = _docio_read_doc_component(handle,uVar7,4,&_timestamp,log_callback);
    if ((long)uVar7 < 0) {
      pfVar13 = handle->file;
      pcVar15 = 
      "Error in reading a timestamp with offset %lu, length %d from a database file \'%s\'";
      sVar12 = 0x54b;
LAB_001146d9:
      status = (fdb_status)uVar7;
      pcVar14 = pfVar13->filename;
      uVar11 = 4;
    }
    else {
      doc->timestamp =
           _timestamp >> 0x18 | (_timestamp & 0xff0000) >> 8 | (_timestamp & 0xff00) << 8 |
           _timestamp << 0x18;
      uVar7 = _docio_read_doc_component(handle,uVar7,8,&_seqnum,log_callback);
      if (-1 < (long)uVar7) {
        (doc->field_3).seqnum =
             _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
             (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
             (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 | (_seqnum & 0xff00) << 0x28
             | _seqnum << 0x38;
        uVar7 = _docio_read_doc_component
                          (handle,uVar7,(uint)(doc->length).metalen,doc->meta,log_callback);
        if ((long)uVar7 < 0) {
          uVar11 = (ulong)(doc->length).metalen;
          pfVar13 = handle->file;
          pcVar15 = 
          "Error in reading the doc metadata with offset %lu, length %d from a database file \'%s\'"
          ;
          sVar12 = 0x566;
        }
        else {
          uVar7 = _docio_read_doc_component
                            (handle,uVar7,(doc->length).bodylen,doc->body,log_callback);
          if (-1 < (long)uVar7) {
            uVar7 = _docio_read_doc_component(handle,uVar7,4,&crc_file,log_callback);
            if (-1 < (long)uVar7) {
              puVar1 = &(doc->length).bodylen;
              uVar6 = get_checksum((uint8_t *)&_length,0x10,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)doc->key,(ulong)(doc->length).keylen,uVar6,
                                   handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)&_timestamp,4,uVar6,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)&_seqnum,8,uVar6,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)doc->meta,(ulong)(doc->length).metalen,uVar6,
                                   handle->file->crc_mode);
              if (((doc->length).flag & 2) == 0) {
                buf = (uint8_t *)doc->body;
                puVar10 = puVar1;
              }
              else {
                buf = (uint8_t *)0x0;
                puVar10 = local_50;
              }
              uVar6 = get_checksum(buf,(ulong)*puVar10,uVar6,handle->file->crc_mode);
              if (uVar6 != crc_file) {
                local_78 = handle->file;
                fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                             ,"docio_read_doc",0x5cd,
                             "doc_body checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                             ,local_78->filename,(ulong)uVar6,(ulong)crc_file,(ulong)_length.keylen,
                             (ulong)_length.metalen,(ulong)_length.bodylen,
                             (ulong)_length.bodylen_ondisk,offset);
                free_docio_object(doc,key_alloc,local_a4,local_a8);
                return -0xf;
              }
              if (bVar2) {
                local_a4 = false;
              }
              else {
                local_a4 = (doc->length).metalen == 0;
              }
              if ((char)local_78 == '\0') {
                local_a8 = *puVar1 == 0;
              }
              else {
                local_a8 = false;
              }
              key_alloc = false;
              goto LAB_00114735;
            }
            pfVar13 = handle->file;
            pcVar15 = 
            "Error in reading a doc\'s CRC value with offset %lu, length %d from a database file \'%s\'"
            ;
            sVar12 = 0x59d;
            goto LAB_001146d9;
          }
          uVar11 = (ulong)(doc->length).bodylen;
          pfVar13 = handle->file;
          pcVar15 = "Error in reading a doc with offset %lu, length %d from a database file \'%s\'";
          sVar12 = 0x58f;
        }
        goto LAB_001146a6;
      }
      pcVar15 = 
      "Error in reading a sequence number with offset %lu, length %d from a database file \'%s\'";
      sVar12 = 0x55a;
      status = (fdb_status)uVar7;
      pcVar14 = handle->file->filename;
      uVar11 = 8;
    }
  }
  fdb_log_impl(log_callback,2,status,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
               ,"docio_read_doc",sVar12,pcVar15,offset,uVar11,pcVar14);
LAB_00114735:
  free_docio_object(doc,key_alloc,local_a4,local_a8);
  return uVar7;
}

Assistant:

int64_t docio_read_doc(struct docio_handle *handle, uint64_t offset,
                       struct docio_object *doc,
                       bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    int body_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    void *comp_body = NULL;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.flag & DOCIO_TXN_COMMITTED) {
        // transaction commit mark
        // read the corresponding doc offset

        // If TXN_COMMITTED flag is set, this doc is not an actual doc, but a
        // transaction commit marker. Thus, all lengths should be zero.
        if (doc->length.keylen || doc->length.metalen ||
            doc->length.bodylen || doc->length.bodylen_ondisk) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Doc length fields in a transaction commit marker "
                    "was not zero in a database file '%s' offset %" _F64,
                    handle->file->filename, offset);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }

        uint64_t doc_offset;
        _offset = _docio_read_doc_component(handle, _offset,
                                            sizeof(doc_offset), &doc_offset,
                                            log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading an offset of a committed doc from an offset %" _F64
                    " in a database file '%s'", offset, handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
        doc->doc_offset = _endian_decode(doc_offset);
        // The offset of the actual document that pointed by this commit marker
        // should not be greater than the file size.
        if (doc->doc_offset > filemgr_get_pos(handle->file)) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Offset %" _F64 " of the actual doc pointed by the "
                    "commit marker is greater than the size %" _F64 " of a database file '%s'",
                    doc->doc_offset, filemgr_get_pos(handle->file),
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }
        return _offset;
    }

    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s' offset %" _F64, doc->length.keylen,
                handle->file->filename, offset);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }
    if (doc->body == NULL && doc->length.bodylen) {
        doc->body = (void *)malloc(doc->length.bodylen);
        body_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset,
                                        doc->length.keylen,
                                        doc->key,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy seqeunce number (optional)
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

#ifdef _DOC_COMP
    if (doc->length.flag & DOCIO_COMPRESSED) {
        comp_body = (void*)malloc(doc->length.bodylen_ondisk);
        _offset = _docio_read_doc_component_comp(handle, _offset, doc->length.bodylen,
                                                 doc->length.bodylen_ondisk, doc->body,
                                                 comp_body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a compressed doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            if (comp_body) {
                free(comp_body);
            }
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    } else {
        _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                            doc->body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    }
#else
    _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                        doc->body, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.bodylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
#endif

#ifdef __CRC32
    uint32_t crc_file, crc;
    _offset = _docio_read_doc_component(handle, _offset, sizeof(crc_file),
                                        (void *)&crc_file, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc's CRC value with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(crc_file),
                handle->file->filename);
        if (comp_body) {
            free(comp_body);
        }
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_length),
                       sizeof(_length),
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->key),
                       doc->length.keylen,
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_timestamp),
                       sizeof(timestamp_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_seqnum),
                       sizeof(fdb_seqnum_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->meta),
                       doc->length.metalen,
                       crc,
                       handle->file->crc_mode);

    if (doc->length.flag & DOCIO_COMPRESSED) {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(comp_body),
                           doc->length.bodylen_ondisk,
                           crc,
                           handle->file->crc_mode);
        if (comp_body) {
            free(comp_body);
        }
    } else {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->body),
                           doc->length.bodylen,
                           crc,
                           handle->file->crc_mode);
    }
    if (crc != crc_file) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                crc, crc_file, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }
#endif

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    uint8_t free_body = body_alloc && !doc->length.bodylen;
    free_docio_object(doc, 0, free_meta, free_body);

    return _offset;
}